

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

void Extra_ThreshCreateInequalities
               (char *pIsop,char *pIsopFneg,int nVars,int *pWofChow,int *pChow,int nChows,
               int nInequalities,unsigned_long **pGreaters,unsigned_long **pSmallers)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  
  sVar4 = strlen(pIsop);
  uVar12 = (ulong)(nVars + 3);
  sVar5 = strlen(pIsopFneg);
  iVar10 = (int)(sVar5 / uVar12);
  iVar9 = (int)(sVar4 / uVar12);
  if (0 < iVar10 * iVar9) {
    uVar6 = 0;
    do {
      if (0 < nChows) {
        puVar1 = pGreaters[uVar6];
        puVar2 = pSmallers[uVar6];
        uVar8 = 0;
        do {
          puVar1[uVar8] = 0;
          puVar2[uVar8] = 0;
          uVar8 = uVar8 + 1;
        } while ((uint)nChows != uVar8);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)(iVar10 * iVar9));
  }
  sVar4 = strlen(pIsop);
  if (0 < (int)sVar4) {
    lVar7 = 0;
    lVar11 = 0;
    pcVar13 = pIsop;
    do {
      if (0 < iVar10) {
        lVar11 = (long)(int)lVar11;
        iVar3 = 0;
        do {
          if (0 < nVars) {
            uVar6 = 0;
            do {
              if (pcVar13[uVar6] == '1') {
                pGreaters[lVar11][pChow[uVar6]] = pGreaters[lVar11][pChow[uVar6]] + 1;
              }
              uVar6 = uVar6 + 1;
            } while ((uint)nVars != uVar6);
          }
          lVar11 = lVar11 + 1;
          iVar3 = iVar3 + 1;
        } while (iVar3 < iVar10);
      }
      lVar7 = lVar7 + uVar12;
      sVar4 = strlen(pIsop);
      pcVar13 = pcVar13 + uVar12;
    } while (lVar7 < (int)sVar4);
  }
  if (0 < iVar9) {
    iVar10 = 0;
    lVar7 = 0;
    do {
      sVar4 = strlen(pIsopFneg);
      if (0 < (int)sVar4) {
        lVar7 = (long)(int)lVar7;
        lVar11 = 0;
        pcVar13 = pIsopFneg;
        do {
          if (0 < nVars) {
            uVar6 = 0;
            do {
              if (pcVar13[uVar6] == '-') {
                pSmallers[lVar7][pChow[uVar6]] = pSmallers[lVar7][pChow[uVar6]] + 1;
              }
              uVar6 = uVar6 + 1;
            } while ((uint)nVars != uVar6);
          }
          lVar7 = lVar7 + 1;
          lVar11 = lVar11 + uVar12;
          sVar4 = strlen(pIsopFneg);
          pcVar13 = pcVar13 + uVar12;
        } while (lVar11 < (int)sVar4);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar9);
  }
  return;
}

Assistant:

void Extra_ThreshCreateInequalities(char * pIsop, char * pIsopFneg, int nVars,
        int * pWofChow, int * pChow, int nChows, int nInequalities,
        unsigned long ** pGreaters, unsigned long ** pSmallers) {
    int i = 0, j = 0, k = 0, m = 0;

    int nCubesIsop = strlen(pIsop) / (nVars + 3);
    int nCubesIsopFneg = strlen(pIsopFneg) / (nVars + 3);

    for (k = 0; k < nCubesIsop * nCubesIsopFneg; k++)
        for (i = 0; i < nChows; i++) {
            pGreaters[k][i] = 0;
            pSmallers[k][i] = 0;
        }
    m = 0;
    for (i = 0; i < (int)strlen(pIsop); i += (nVars + 3))
        for (j = 0; j < nCubesIsopFneg; j++) {
            for (k = 0; k < nVars; k++)
                if (pIsop[i + k] == '1')
                    pGreaters[m][pChow[k]] = pGreaters[m][(pChow[k])] + 1;

            m++;
        }
    m = 0;
    for (i = 0; i < nCubesIsop; i++)
        for (j = 0; j < (int)strlen(pIsopFneg); j += (nVars + 3)) {
            for (k = 0; k < nVars; k++)
                if (pIsopFneg[j + k] == '-')
                    pSmallers[m][pChow[k]] = pSmallers[m][pChow[k]] + 1;
            m++;
        }
//        Extra_ThreshPrintInequalities( pGreaters, pSmallers, nChows, nInequalities);
//        printf( "\nInequalities was Created \n");
}